

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O0

bool __thiscall
sptk::GaussianMixtureModeling::Initialize
          (GaussianMixtureModeling *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          )

{
  bool bVar1;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices_00;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  const_reference this_00;
  reference this_01;
  double *pdVar6;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  long in_RDI;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_R8;
  double dVar7;
  double dVar8;
  int m_1;
  int l_1;
  int k_3;
  double diff2;
  int m;
  double diff1;
  int l;
  double *mu;
  int k_2;
  double *x;
  int t_1;
  int k_1;
  int k;
  int t;
  int *dst;
  int *src;
  vector<int,_std::allocator<int>_> num_data_in_cluster;
  int num_data;
  LindeBuzoGrayAlgorithm lbg;
  double distance;
  int seed;
  double splitting_factor;
  double convergence_threshold;
  int num_iteration;
  vector<int,_std::allocator<int>_> codebook_indices;
  vector<double,_std::allocator<double>_> mean;
  vector<double,_std::allocator<double>_> *vector;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  Buffer buffer;
  StatisticsAccumulation statistics_accumulation;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  LindeBuzoGrayAlgorithm *in_stack_fffffffffffffc70;
  SymmetricMatrix *in_stack_fffffffffffffc78;
  Buffer *in_stack_fffffffffffffc80;
  size_type in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  double in_stack_fffffffffffffc98;
  double in_stack_fffffffffffffca0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffca8;
  GaussianMixtureModeling *in_stack_fffffffffffffcb0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  StatisticsAccumulation *in_stack_fffffffffffffcc8;
  int seed_00;
  undefined8 in_stack_fffffffffffffcd0;
  GaussianMixtureModeling *this_02;
  Row local_2f0;
  Row local_2d8;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  Row local_2b0;
  double local_298;
  Row local_290;
  int local_274;
  double local_270;
  int local_264;
  reference local_260;
  int local_254;
  const_reference local_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  Buffer *in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  StatisticsAccumulation *in_stack_fffffffffffffdd8;
  vector<int,_std::allocator<int>_> local_220;
  int local_204;
  double *in_stack_fffffffffffffe78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffe88;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffe90;
  LindeBuzoGrayAlgorithm *in_stack_fffffffffffffe98;
  undefined1 local_135 [57];
  uint local_fc;
  reference local_f8;
  vector<double,_std::allocator<double>_> *local_f0;
  __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_e8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e0;
  StatisticsAccumulation local_48;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_30;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_18;
  byte local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)0x10f1ec);
  StatisticsAccumulation::StatisticsAccumulation(&local_48,*(int *)(in_RDI + 8),1,false,false);
  StatisticsAccumulation::Buffer::Buffer(in_stack_fffffffffffffc80);
  local_e0 = local_18;
  local_e8._M_current =
       (vector<double,_std::allocator<double>_> *)
       std::
       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  local_f0 = (vector<double,_std::allocator<double>_> *)
             std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)in_stack_fffffffffffffc70,
                       (__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    seed_00 = (int)in_stack_fffffffffffffcd0;
    if (!bVar1) break;
    local_f8 = __gnu_cxx::
               __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
               ::operator*(&local_e8);
    bVar1 = StatisticsAccumulation::Run
                      (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8
                      );
    seed_00 = (int)in_stack_fffffffffffffcd0;
    if (!bVar1) {
      local_1 = 0;
      local_fc = 1;
      goto LAB_0010f3ce;
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&local_e8);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10f331);
  bVar1 = StatisticsAccumulation::GetMean
                    (in_stack_fffffffffffffcc8,
                     (Buffer *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcb8);
  if (bVar1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffffc80,(value_type *)in_stack_fffffffffffffc78);
  }
  else {
    local_1 = 0;
  }
  local_fc = (uint)!bVar1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc80);
LAB_0010f3ce:
  StatisticsAccumulation::Buffer::~Buffer((Buffer *)in_stack_fffffffffffffc70);
  StatisticsAccumulation::~StatisticsAccumulation(&local_48);
  if (local_fc != 0) goto LAB_0010fdda;
  covariance_matrices_00 =
       (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
       std::
       vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ::size(local_18);
  local_135._1_4_ = 0;
  this_02 = (GaussianMixtureModeling *)local_135;
  std::allocator<int>::allocator((allocator<int> *)0x10f42f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),in_stack_fffffffffffffc88
             ,(value_type *)in_stack_fffffffffffffc80,(allocator_type *)in_stack_fffffffffffffc78);
  std::allocator<int>::~allocator((allocator<int> *)0x10f463);
  if (*(int *)(in_RDI + 0xc) < 2) {
LAB_0010f5f1:
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(local_18);
    local_204 = (int)sVar2;
    std::allocator<int>::allocator((allocator<int> *)0x10f62b);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88,(allocator_type *)in_stack_fffffffffffffc80);
    std::allocator<int>::~allocator((allocator<int> *)0x10f651);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_135 + 5),0);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_220,0);
    for (local_23c = 0; local_23c < local_204; local_23c = local_23c + 1) {
      pvVar4[pvVar3[local_23c]] = pvVar4[pvVar3[local_23c]] + 1;
    }
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88);
    for (local_240 = 0; local_240 < *(int *)(in_RDI + 0xc); local_240 = local_240 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_220,(long)local_240);
      dVar7 = (double)*pvVar3 / (double)local_204;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)local_240);
      *pvVar5 = dVar7;
    }
    FloorWeight(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::resize
              ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc88);
    for (local_244 = 0; local_244 < *(int *)(in_RDI + 0xc); local_244 = local_244 + 1) {
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                (local_30,(long)local_244);
      SymmetricMatrix::Resize
                ((SymmetricMatrix *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                 (int)(in_stack_fffffffffffffc88 >> 0x20));
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                (local_30,(long)local_244);
      SymmetricMatrix::Fill
                ((SymmetricMatrix *)in_stack_fffffffffffffc80,(double)in_stack_fffffffffffffc78);
    }
    for (local_248 = 0; local_248 < local_204; local_248 = local_248 + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](local_18,(long)local_248);
      local_250 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_135 + 5),(long)local_248);
      local_254 = *pvVar3;
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](local_28,(long)local_254);
      local_260 = std::vector<double,_std::allocator<double>_>::operator[](this_01,0);
      for (local_264 = 0; local_264 <= *(int *)(in_RDI + 8); local_264 = local_264 + 1) {
        local_270 = local_250[local_264] - local_260[local_264];
        local_274 = local_264;
        if ((*(byte *)(in_RDI + 0xa8) & 1) == 0) {
          local_274 = 0;
        }
        for (; local_274 <= local_264; local_274 = local_274 + 1) {
          SymmetricMatrix::operator[]
                    (in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
          pdVar6 = SymmetricMatrix::Row::operator[]
                             ((Row *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
          dVar7 = *pdVar6;
          SymmetricMatrix::Row::~Row(&local_290);
          if ((dVar7 != 0.0) || (NAN(dVar7))) {
            dVar8 = local_250[local_274] - local_260[local_274];
            dVar7 = local_270;
            local_298 = dVar8;
            std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                      (local_30,(long)local_254);
            SymmetricMatrix::operator[]
                      (in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
            pdVar6 = SymmetricMatrix::Row::operator[]
                               ((Row *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
            *pdVar6 = dVar7 * dVar8 + *pdVar6;
            SymmetricMatrix::Row::~Row(&local_2b0);
          }
        }
      }
    }
    for (local_2b4 = 0; local_2b4 < *(int *)(in_RDI + 0xc); local_2b4 = local_2b4 + 1) {
      for (local_2b8 = 0; local_2b8 <= *(int *)(in_RDI + 8); local_2b8 = local_2b8 + 1) {
        local_2bc = local_2b8;
        if ((*(byte *)(in_RDI + 0xa8) & 1) == 0) {
          local_2bc = 0;
        }
        for (; local_2bc <= local_2b8; local_2bc = local_2bc + 1) {
          SymmetricMatrix::operator[]
                    (in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
          pdVar6 = SymmetricMatrix::Row::operator[]
                             ((Row *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
          in_stack_fffffffffffffc80 = (Buffer *)*pdVar6;
          SymmetricMatrix::Row::~Row(&local_2d8);
          if (((double)in_stack_fffffffffffffc80 != 0.0) || (NAN((double)in_stack_fffffffffffffc80))
             ) {
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_220,(long)local_2b4);
            in_stack_fffffffffffffc78 = (SymmetricMatrix *)(double)*pvVar3;
            std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                      (local_30,(long)local_2b4);
            SymmetricMatrix::operator[]
                      (in_stack_fffffffffffffc78,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20));
            in_stack_fffffffffffffc70 =
                 (LindeBuzoGrayAlgorithm *)
                 SymmetricMatrix::Row::operator[]
                           ((Row *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
            in_stack_fffffffffffffc70->_vptr_LindeBuzoGrayAlgorithm =
                 (_func_int **)
                 ((double)in_stack_fffffffffffffc70->_vptr_LindeBuzoGrayAlgorithm /
                 (double)in_stack_fffffffffffffc78);
            SymmetricMatrix::Row::~Row(&local_2f0);
          }
        }
      }
    }
    FloorVariance(this_02,covariance_matrices_00);
    local_1 = 1;
    local_fc = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80);
  }
  else {
    LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
              ((LindeBuzoGrayAlgorithm *)
               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
               (int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),(int)in_stack_fffffffffffffcb8,
               (int)((ulong)in_stack_fffffffffffffcb0 >> 0x20),(int)in_stack_fffffffffffffcb0,
               (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98,seed_00);
    bVar1 = LindeBuzoGrayAlgorithm::Run
                      (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88
                       ,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (!bVar1) {
      local_1 = 0;
    }
    local_fc = (uint)!bVar1;
    LindeBuzoGrayAlgorithm::~LindeBuzoGrayAlgorithm(in_stack_fffffffffffffc70);
    if (local_fc == 0) goto LAB_0010f5f1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80);
LAB_0010fdda:
  return (bool)(local_1 & 1);
}

Assistant:

bool GaussianMixtureModeling::Initialize(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<double>* weights,
    std::vector<std::vector<double> >* mean_vectors,
    std::vector<SymmetricMatrix>* covariance_matrices) const {
  // Initialize codebook.
  {
    mean_vectors->clear();
    StatisticsAccumulation statistics_accumulation(num_order_, 1);
    StatisticsAccumulation::Buffer buffer;

    for (const std::vector<double>& vector : input_vectors) {
      if (!statistics_accumulation.Run(vector, &buffer)) {
        return false;
      }
    }

    std::vector<double> mean;
    if (!statistics_accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    mean_vectors->push_back(mean);
  }

  // Initialize mean vectors.
  std::vector<int> codebook_indices(input_vectors.size(), 0);
  if (2 <= num_mixture_) {
    const int num_iteration(1000);
    const double convergence_threshold(1e-5);
    const double splitting_factor(1e-5);
    const int seed(1);
    double distance;
    LindeBuzoGrayAlgorithm lbg(num_order_, 1, num_mixture_, 1, num_iteration,
                               convergence_threshold, splitting_factor, seed);
    if (!lbg.Run(input_vectors, mean_vectors, &codebook_indices, &distance)) {
      return false;
    }
  }

  // Count number of data for each cluster.
  const int num_data(static_cast<int>(input_vectors.size()));
  std::vector<int> num_data_in_cluster(num_mixture_);
  {
    const int* src(&(codebook_indices[0]));
    int* dst(&(num_data_in_cluster[0]));
    for (int t(0); t < num_data; ++t) {
      ++dst[src[t]];
    }
  }

  // Initialize weights.
  {
    weights->resize(num_mixture_);
    for (int k(0); k < num_mixture_; ++k) {
      (*weights)[k] = static_cast<double>(num_data_in_cluster[k]) / num_data;
    }
    FloorWeight(weights);
  }

  // Initialize covariances.
  {
    covariance_matrices->resize(num_mixture_);
    for (int k(0); k < num_mixture_; ++k) {
      (*covariance_matrices)[k].Resize(num_order_ + 1);
      (*covariance_matrices)[k].Fill(0.0);
    }

    for (int t(0); t < num_data; ++t) {
      const double* x(&(input_vectors[t][0]));
      const int k(codebook_indices[t]);
      const double* mu(&((*mean_vectors)[k][0]));
      for (int l(0); l <= num_order_; ++l) {
        const double diff1(x[l] - mu[l]);
        for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
          if (0.0 != mask_[l][m]) {
            const double diff2(x[m] - mu[m]);
            (*covariance_matrices)[k][l][m] += diff1 * diff2;
          }
        }
      }
    }

    for (int k(0); k < num_mixture_; ++k) {
      for (int l(0); l <= num_order_; ++l) {
        for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
          if (0.0 != mask_[l][m]) {
            (*covariance_matrices)[k][l][m] /= num_data_in_cluster[k];
          }
        }
      }
    }
    FloorVariance(covariance_matrices);
  }

  return true;
}